

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.cpp
# Opt level: O2

void __thiscall DatUnpacker::Exception::Exception(Exception *this,string *message)

{
  *(undefined ***)this = &PTR__Exception_0010f820;
  std::__cxx11::string::string((string *)&this->_message,(string *)message);
  return;
}

Assistant:

Exception::Exception(const std::string& message) : _message(message)
    {
    }